

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::~IfcCurveBoundedPlane(IfcCurveBoundedPlane *this)

{
  ~IfcCurveBoundedPlane((IfcCurveBoundedPlane *)&this[-1].super_IfcBoundedSurface.field_0x50);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}